

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O0

void thread_rwlock_trylock_peer(void *unused)

{
  int iVar1;
  void *unused_local;
  
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x72,"UV_EBUSY == uv_rwlock_tryrdlock(&rwlock)");
    abort();
  }
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if (iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x73,"UV_EBUSY == uv_rwlock_trywrlock(&rwlock)");
    abort();
  }
  synchronize();
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x77,"0 == uv_rwlock_tryrdlock(&rwlock)");
    abort();
  }
  uv_rwlock_rdunlock(&rwlock);
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if (iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x79,"UV_EBUSY == uv_rwlock_trywrlock(&rwlock)");
    abort();
  }
  synchronize();
  iVar1 = uv_rwlock_trywrlock(&rwlock);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x7d,"0 == uv_rwlock_trywrlock(&rwlock)");
    abort();
  }
  synchronize();
  uv_rwlock_wrunlock(&rwlock);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
            ,0x82,"0 == uv_rwlock_tryrdlock(&rwlock)");
    abort();
  }
  synchronize();
  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();
  uv_mutex_unlock(&mutex);
  return;
}

Assistant:

static void thread_rwlock_trylock_peer(void* unused) {
  (void) &unused;

  uv_mutex_lock(&mutex);

  /* Write lock held by other thread. */
  ASSERT(UV_EBUSY == uv_rwlock_tryrdlock(&rwlock));
  ASSERT(UV_EBUSY == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT(0 == uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT(UV_EBUSY == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Acquire write lock. */
  ASSERT(0 == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Release write lock and acquire read lock. */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT(0 == uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();  /* Signal main thread we're going away. */
  uv_mutex_unlock(&mutex);
}